

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O3

void __thiscall wasm::ThreadPool::initialize(ThreadPool *this,size_t num)

{
  undefined8 uVar1;
  Thread *this_00;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  
  if (num != 1) {
    local_40 = (undefined1  [8])threadMutex;
    lock._M_device._0_1_ = 0;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    lock._M_device._0_1_ = 1;
    LOCK();
    (this->ready).super___atomic_base<unsigned_long>._M_i =
         (long)(this->threads).
               super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->threads).
               super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    UNLOCK();
    resetThreadsAreReady(this);
    if (num != 0) {
      do {
        this_00 = (Thread *)operator_new(0x90);
        Thread::Thread(this_00,this);
        lock._8_8_ = this_00;
        std::
        vector<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>,std::allocator<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>>
        ::emplace_back<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>
                  ((vector<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>,std::allocator<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>>
                    *)this,(unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_> *)
                           &lock._M_owns);
        uVar1 = lock._8_8_;
        if (lock._8_8_ != 0) {
          Thread::~Thread((Thread *)lock._8_8_);
          operator_delete((void *)uVar1,0x90);
        }
        num = num - 1;
      } while (num != 0);
    }
    if ((this->ready).super___atomic_base<unsigned_long>._M_i !=
        (long)(this->threads).
              super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->threads).
              super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      do {
        std::condition_variable::wait((unique_lock *)&this->condition);
      } while ((this->ready).super___atomic_base<unsigned_long>._M_i !=
               (long)(this->threads).
                     super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->threads).
                     super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  }
  return;
}

Assistant:

void ThreadPool::initialize(size_t num) {
  if (num == 1) {
    return; // no multiple cores, don't create threads
  }
  DEBUG_POOL("initialize()\n");
  std::unique_lock<std::mutex> lock(threadMutex);
  // initial state before first resetThreadsAreReady()
  ready.store(threads.size());
  resetThreadsAreReady();
  for (size_t i = 0; i < num; i++) {
    try {
      threads.emplace_back(std::make_unique<Thread>(this));
    } catch (std::system_error&) {
      // failed to create a thread - don't use multithreading, as if num cores
      // == 1
      DEBUG_POOL("could not create thread\n");
      threads.clear();
      return;
    }
  }
  DEBUG_POOL("initialize() waiting\n");
  condition.wait(lock, [this]() { return areThreadsReady(); });
  DEBUG_POOL("initialize() is done\n");
}